

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.hpp
# Opt level: O1

void just::test::display<char_const*>(ostream *out_,char **t_)

{
  char *__s;
  size_t sVar1;
  
  __s = *t_;
  if (__s != (char *)0x0) {
    sVar1 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>(out_,__s,sVar1);
    return;
  }
  std::ios::clear((int)out_ + (int)*(undefined8 *)(*(long *)out_ + -0x18));
  return;
}

Assistant:

void display(std::ostream& out_, const T& t_)
    {
      out_ << t_;
    }